

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O2

void emit_GLSL_CALLNZ(Context *ctx)

{
  size_t in_RCX;
  char *fmt;
  char src1 [64];
  char src0 [64];
  
  make_GLSL_srcarg_string_masked(ctx,0,src0,in_RCX);
  make_GLSL_srcarg_string_masked(ctx,1,src1,in_RCX);
  fmt = "if (%s) { %s(); }";
  if (0 < ctx->loops) {
    fmt = "if (%s) { %s(aL); }";
  }
  output_line(ctx,fmt,src1,src0);
  return;
}

Assistant:

static void emit_GLSL_CALLNZ(Context *ctx)
{
    // !!! FIXME: if src1 is a constbool that's true, we can remove the
    // !!! FIXME:  if. If it's false, we can make this a no-op.
    char src0[64]; make_GLSL_srcarg_string_masked(ctx, 0, src0, sizeof (src0));
    char src1[64]; make_GLSL_srcarg_string_masked(ctx, 1, src1, sizeof (src1));

    if (ctx->loops > 0)
        output_line(ctx, "if (%s) { %s(aL); }", src1, src0);
    else
        output_line(ctx, "if (%s) { %s(); }", src1, src0);
}